

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O1

int __thiscall jrtplib::RTPSession::SendRTCPData(RTPSession *this,void *data,size_t len)

{
  int iVar1;
  size_t sendLen;
  void *pSendData;
  
  if (this->m_changeOutgoingData == false) {
    iVar1 = (*(this->rtptrans->super_RTPMemoryObject)._vptr_RTPMemoryObject[0xf])();
    return iVar1;
  }
  iVar1 = (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x15])(this,data,len,0);
  return iVar1;
}

Assistant:

int RTPSession::SendRTCPData(const void *data, size_t len)
{
	if (!m_changeOutgoingData)
		return rtptrans->SendRTCPData(data, len);

	void *pSendData = 0;
	size_t sendLen = 0;
	int status = 0;

	status = OnChangeRTPOrRTCPData(data, len, false, &pSendData, &sendLen);
	if (status < 0)
		return status;

	if (pSendData)
	{
		status = rtptrans->SendRTCPData(pSendData, sendLen);
		OnSentRTPOrRTCPData(pSendData, sendLen, false);
	}

	return status;
}